

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzverysparsematrix.cpp
# Opt level: O2

void __thiscall
TPZVerySparseMatrix<long_double>::WriteMap
          (TPZVerySparseMatrix<long_double> *this,TPZStream *buf,int withclassid,
          map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
          *TheMap)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  undefined4 local_3c;
  _Rb_tree_color local_38;
  int mapsz;
  
  mapsz = (int)(TheMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  (*buf->_vptr_TPZStream[3])(buf,&mapsz,1);
  for (p_Var1 = (TheMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(TheMap->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_38 = p_Var1[1]._M_color;
    local_3c = *(undefined4 *)&p_Var1[1]._M_parent;
    (*buf->_vptr_TPZStream[3])(buf,&local_38,1);
    (*buf->_vptr_TPZStream[3])(buf,&local_3c,1);
    (*buf->_vptr_TPZStream[9])(buf,&p_Var1[1]._M_left,1);
  }
  return;
}

Assistant:

void TPZVerySparseMatrix<TVar>::WriteMap(TPZStream &buf, int withclassid, const std::map<std::pair<int64_t, int64_t>, TVar> & TheMap) const
{
	int mapsz = TheMap.size();
	buf.Write(&mapsz, 1);
	typename std::map<std::pair<int64_t, int64_t>, TVar>::const_iterator it;
	for(it = TheMap.begin(); it != TheMap.end(); it++)
	{
		int ii = 0, jj = 0;
		ii = it->first.first;
		jj = it->first.second;
		buf.Write(&ii, 1);
		buf.Write(&jj, 1);
		buf.Write(&it->second, 1);
	}
}